

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

int ColorIsPlausible(pyhanabi_card_knowledge_t *knowledge,int color)

{
  int iVar1;
  
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x49,"int ColorIsPlausible(pyhanabi_card_knowledge_t *, int)");
  }
  if (knowledge->knowledge != (void *)0x0) {
    iVar1 = color + 0x3f;
    if (-1 < color) {
      iVar1 = color;
    }
    return (int)((*(ulong *)((long)(iVar1 >> 6) * 8 + *(long *)((long)knowledge->knowledge + 8) + -8
                            + (ulong)(((long)color & 0x800000000000003fU) < 0x8000000000000001) * 8)
                  >> ((long)color & 0x3fU) & 1) != 0);
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x4a,"int ColorIsPlausible(pyhanabi_card_knowledge_t *, int)");
}

Assistant:

int ColorIsPlausible(pyhanabi_card_knowledge_t* knowledge, int color) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->ColorPlausible(color);
}